

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

CURLcode telrcv(Curl_easy *data,uchar *inbuf,ssize_t count)

{
  byte bVar1;
  TELNET *pTVar2;
  uchar *puVar3;
  byte *pbVar4;
  CURLcode CVar5;
  TELNET *tn;
  int startwrite;
  int in;
  CURLcode result;
  uchar c;
  ssize_t count_local;
  uchar *inbuf_local;
  Curl_easy *data_local;
  
  tn._4_4_ = 0;
  tn._0_4_ = -1;
  pTVar2 = (data->req).p.telnet;
  _result = count;
  do {
    if (_result == 0) {
      if (((int)tn < 0) ||
         (data_local._4_4_ =
               Curl_client_write(data,1,(char *)(inbuf + (int)tn),(long)(tn._4_4_ - (int)tn)),
         data_local._4_4_ == CURLE_OK)) {
        data_local._4_4_ = CURLE_OK;
      }
      return data_local._4_4_;
    }
    bVar1 = inbuf[tn._4_4_];
    switch(pTVar2->telrcv_state) {
    case CURL_TS_DATA:
      if (bVar1 == 0xff) {
        pTVar2->telrcv_state = CURL_TS_IAC;
        if ((-1 < (int)tn) &&
           (CVar5 = Curl_client_write(data,1,(char *)(inbuf + (int)tn),(long)(tn._4_4_ - (int)tn)),
           CVar5 != CURLE_OK)) {
          return CVar5;
        }
        tn._0_4_ = -1;
      }
      else {
        if (bVar1 == 0xd) {
          pTVar2->telrcv_state = CURL_TS_CR;
        }
        if ((int)tn < 0) {
          tn._0_4_ = tn._4_4_;
        }
      }
      break;
    case CURL_TS_IAC:
code_r0x00193611:
      switch(bVar1) {
      case 0xf1:
      case 0xf2:
      case 0xf9:
      default:
        pTVar2->telrcv_state = CURL_TS_DATA;
        printoption(data,"RCVD",0xff,(uint)bVar1);
        break;
      case 0xfa:
        pTVar2->subpointer = pTVar2->subbuffer;
        pTVar2->telrcv_state = CURL_TS_SB;
        break;
      case 0xfb:
        pTVar2->telrcv_state = CURL_TS_WILL;
        break;
      case 0xfc:
        pTVar2->telrcv_state = CURL_TS_WONT;
        break;
      case 0xfd:
        pTVar2->telrcv_state = CURL_TS_DO;
        break;
      case 0xfe:
        pTVar2->telrcv_state = CURL_TS_DONT;
        break;
      case 0xff:
        pTVar2->telrcv_state = CURL_TS_DATA;
        if ((int)tn < 0) {
          tn._0_4_ = tn._4_4_;
        }
      }
      break;
    case CURL_TS_WILL:
      printoption(data,"RCVD",0xfb,(uint)bVar1);
      pTVar2->please_negotiate = 1;
      rec_will(data,(uint)bVar1);
      pTVar2->telrcv_state = CURL_TS_DATA;
      break;
    case CURL_TS_WONT:
      printoption(data,"RCVD",0xfc,(uint)bVar1);
      pTVar2->please_negotiate = 1;
      rec_wont(data,(uint)bVar1);
      pTVar2->telrcv_state = CURL_TS_DATA;
      break;
    case CURL_TS_DO:
      printoption(data,"RCVD",0xfd,(uint)bVar1);
      pTVar2->please_negotiate = 1;
      rec_do(data,(uint)bVar1);
      pTVar2->telrcv_state = CURL_TS_DATA;
      break;
    case CURL_TS_DONT:
      printoption(data,"RCVD",0xfe,(uint)bVar1);
      pTVar2->please_negotiate = 1;
      rec_dont(data,(uint)bVar1);
      pTVar2->telrcv_state = CURL_TS_DATA;
      break;
    case CURL_TS_CR:
      pTVar2->telrcv_state = CURL_TS_DATA;
      if (bVar1 == 0) {
        if ((-1 < (int)tn) &&
           (CVar5 = Curl_client_write(data,1,(char *)(inbuf + (int)tn),(long)(tn._4_4_ - (int)tn)),
           CVar5 != CURLE_OK)) {
          return CVar5;
        }
        tn._0_4_ = -1;
      }
      else if ((int)tn < 0) {
        tn._0_4_ = tn._4_4_;
      }
      break;
    case CURL_TS_SB:
      if (bVar1 == 0xff) {
        pTVar2->telrcv_state = CURL_TS_SE;
      }
      else if (pTVar2->subpointer < &pTVar2->subpointer) {
        pbVar4 = pTVar2->subpointer;
        pTVar2->subpointer = pbVar4 + 1;
        *pbVar4 = bVar1;
      }
      break;
    case CURL_TS_SE:
      if (bVar1 == 0xf0) {
        if (pTVar2->subpointer < &pTVar2->subpointer) {
          puVar3 = pTVar2->subpointer;
          pTVar2->subpointer = puVar3 + 1;
          *puVar3 = 0xff;
        }
        if (pTVar2->subpointer < &pTVar2->subpointer) {
          puVar3 = pTVar2->subpointer;
          pTVar2->subpointer = puVar3 + 1;
          *puVar3 = 0xf0;
        }
        pTVar2->subpointer = pTVar2->subpointer + -2;
        pTVar2->subend = pTVar2->subpointer;
        pTVar2->subpointer = pTVar2->subbuffer;
        suboption(data);
        pTVar2->telrcv_state = CURL_TS_DATA;
      }
      else {
        if (bVar1 != 0xff) {
          if (pTVar2->subpointer < &pTVar2->subpointer) {
            puVar3 = pTVar2->subpointer;
            pTVar2->subpointer = puVar3 + 1;
            *puVar3 = 0xff;
          }
          if (pTVar2->subpointer < &pTVar2->subpointer) {
            pbVar4 = pTVar2->subpointer;
            pTVar2->subpointer = pbVar4 + 1;
            *pbVar4 = bVar1;
          }
          pTVar2->subpointer = pTVar2->subpointer + -2;
          pTVar2->subend = pTVar2->subpointer;
          pTVar2->subpointer = pTVar2->subbuffer;
          printoption(data,"In SUBOPTION processing, RCVD",0xff,(uint)bVar1);
          suboption(data);
          pTVar2->telrcv_state = CURL_TS_IAC;
          goto code_r0x00193611;
        }
        if (pTVar2->subpointer < &pTVar2->subpointer) {
          puVar3 = pTVar2->subpointer;
          pTVar2->subpointer = puVar3 + 1;
          *puVar3 = 0xff;
        }
        pTVar2->telrcv_state = CURL_TS_SB;
      }
    }
    tn._4_4_ = tn._4_4_ + 1;
    _result = _result + -1;
  } while( true );
}

Assistant:

static
CURLcode telrcv(struct Curl_easy *data,
                const unsigned char *inbuf, /* Data received from socket */
                ssize_t count)              /* Number of bytes received */
{
  unsigned char c;
  CURLcode result;
  int in = 0;
  int startwrite = -1;
  struct TELNET *tn = data->req.p.telnet;

#define startskipping()                                       \
  if(startwrite >= 0) {                                       \
    result = Curl_client_write(data,                          \
                               CLIENTWRITE_BODY,              \
                               (char *)&inbuf[startwrite],    \
                               in-startwrite);                \
    if(result)                                                \
      return result;                                          \
  }                                                           \
  startwrite = -1

#define writebyte() \
    if(startwrite < 0) \
      startwrite = in

#define bufferflush() startskipping()

  while(count--) {
    c = inbuf[in];

    switch(tn->telrcv_state) {
    case CURL_TS_CR:
      tn->telrcv_state = CURL_TS_DATA;
      if(c == '\0') {
        startskipping();
        break;   /* Ignore \0 after CR */
      }
      writebyte();
      break;

    case CURL_TS_DATA:
      if(c == CURL_IAC) {
        tn->telrcv_state = CURL_TS_IAC;
        startskipping();
        break;
      }
      else if(c == '\r')
        tn->telrcv_state = CURL_TS_CR;
      writebyte();
      break;

    case CURL_TS_IAC:
process_iac:
      DEBUGASSERT(startwrite < 0);
      switch(c) {
      case CURL_WILL:
        tn->telrcv_state = CURL_TS_WILL;
        break;
      case CURL_WONT:
        tn->telrcv_state = CURL_TS_WONT;
        break;
      case CURL_DO:
        tn->telrcv_state = CURL_TS_DO;
        break;
      case CURL_DONT:
        tn->telrcv_state = CURL_TS_DONT;
        break;
      case CURL_SB:
        CURL_SB_CLEAR(tn);
        tn->telrcv_state = CURL_TS_SB;
        break;
      case CURL_IAC:
        tn->telrcv_state = CURL_TS_DATA;
        writebyte();
        break;
      case CURL_DM:
      case CURL_NOP:
      case CURL_GA:
      default:
        tn->telrcv_state = CURL_TS_DATA;
        printoption(data, "RCVD", CURL_IAC, c);
        break;
      }
      break;

      case CURL_TS_WILL:
        printoption(data, "RCVD", CURL_WILL, c);
        tn->please_negotiate = 1;
        rec_will(data, c);
        tn->telrcv_state = CURL_TS_DATA;
        break;

      case CURL_TS_WONT:
        printoption(data, "RCVD", CURL_WONT, c);
        tn->please_negotiate = 1;
        rec_wont(data, c);
        tn->telrcv_state = CURL_TS_DATA;
        break;

      case CURL_TS_DO:
        printoption(data, "RCVD", CURL_DO, c);
        tn->please_negotiate = 1;
        rec_do(data, c);
        tn->telrcv_state = CURL_TS_DATA;
        break;

      case CURL_TS_DONT:
        printoption(data, "RCVD", CURL_DONT, c);
        tn->please_negotiate = 1;
        rec_dont(data, c);
        tn->telrcv_state = CURL_TS_DATA;
        break;

      case CURL_TS_SB:
        if(c == CURL_IAC)
          tn->telrcv_state = CURL_TS_SE;
        else
          CURL_SB_ACCUM(tn, c);
        break;

      case CURL_TS_SE:
        if(c != CURL_SE) {
          if(c != CURL_IAC) {
            /*
             * This is an error. We only expect to get "IAC IAC" or "IAC SE".
             * Several things may have happened. An IAC was not doubled, the
             * IAC SE was left off, or another option got inserted into the
             * suboption are all possibilities. If we assume that the IAC was
             * not doubled, and really the IAC SE was left off, we could get
             * into an infinite loop here. So, instead, we terminate the
             * suboption, and process the partial suboption if we can.
             */
            CURL_SB_ACCUM(tn, CURL_IAC);
            CURL_SB_ACCUM(tn, c);
            tn->subpointer -= 2;
            CURL_SB_TERM(tn);

            printoption(data, "In SUBOPTION processing, RCVD", CURL_IAC, c);
            suboption(data);   /* handle sub-option */
            tn->telrcv_state = CURL_TS_IAC;
            goto process_iac;
          }
          CURL_SB_ACCUM(tn, c);
          tn->telrcv_state = CURL_TS_SB;
        }
        else {
          CURL_SB_ACCUM(tn, CURL_IAC);
          CURL_SB_ACCUM(tn, CURL_SE);
          tn->subpointer -= 2;
          CURL_SB_TERM(tn);
          suboption(data);   /* handle sub-option */
          tn->telrcv_state = CURL_TS_DATA;
        }
        break;
    }
    ++in;
  }
  bufferflush();
  return CURLE_OK;
}